

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O2

void vkt::synchronization::anon_unknown_0::createVulkanBuffer
               (DeviceInterface *vkd,VkDevice device,Allocator *allocator,
               BufferParameters *bufferParameters,Buffer *buffer,MemoryRequirement visibility)

{
  Allocation *pAVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkResult VVar2;
  undefined4 in_stack_ffffffffffffff40;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_b8;
  undefined1 local_98 [24];
  VkAllocationCallbacks *pVStack_80;
  size_t local_78;
  VkBufferCreateInfo local_68;
  
  local_68.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_68._4_4_ = 0xcdcdcdcd;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68._20_4_ = 0xcdcdcdcd;
  local_68.size = bufferParameters->size;
  local_68.usage = bufferParameters->usage;
  local_68.sharingMode = bufferParameters->sharingMode;
  local_68._44_4_ = 0xcdcdcdcd;
  local_68.queueFamilyIndexCount = bufferParameters->queueFamilyCount;
  local_68.pQueueFamilyIndices = bufferParameters->queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_b8,vkd,device,&local_68,
                     (VkAllocationCallbacks *)0x0);
  local_98._16_8_ = local_b8.m_data.deleter.m_device;
  pVStack_80 = local_b8.m_data.deleter.m_allocator;
  local_98._0_8_ = local_b8.m_data.object.m_internal;
  local_98._8_8_ = local_b8.m_data.deleter.m_deviceIface;
  local_b8.m_data.object.m_internal = 0;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&(buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)local_98._16_8_;
  (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       pVStack_80;
  (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_98._0_8_;
  (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_98._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_b8);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)local_98,vkd,device,
             (VkBuffer)
             (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
            );
  (*allocator->_vptr_Allocator[3])
            (&local_b8,allocator,(VkMemoryRequirements *)local_98,(ulong)visibility.m_flags);
  local_b8.m_data.object.m_internal = 0;
  data._8_4_ = in_stack_ffffffffffffff40;
  data.ptr = (Allocation *)device;
  data._12_4_ = visibility.m_flags;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)buffer,data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_b8);
  pAVar1 = (buffer->allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  VVar2 = (*vkd->_vptr_DeviceInterface[0xc])
                    (vkd,device,
                     (buffer->buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                     m_internal,(pAVar1->m_memory).m_internal,pAVar1->m_offset);
  ::vk::checkResult(VVar2,
                    "vkd.bindBufferMemory(device, *buffer.buffer, buffer.allocation->getMemory(), buffer.allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                    ,0xb1);
  if (bufferParameters->memory != (void *)0x0) {
    local_98._0_8_ = 0xcdcdcdcd00000006;
    local_98._8_8_ = 0;
    pAVar1 = (buffer->allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    local_98._16_8_ = (pAVar1->m_memory).m_internal;
    pVStack_80 = (VkAllocationCallbacks *)pAVar1->m_offset;
    local_78 = bufferParameters->size;
    memcpy(pAVar1->m_hostPtr,bufferParameters->memory,local_78);
    VVar2 = (*vkd->_vptr_DeviceInterface[9])(vkd,device,1,local_98);
    ::vk::checkResult(VVar2,"vkd.flushMappedMemoryRanges(device, 1, &range)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                      ,0xc3);
    local_b8.m_data.object.m_internal = 0xcdcdcdcd0000002e;
    local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_b8.m_data.deleter.m_device =
         (VkDevice)CONCAT44(bufferParameters->inputBarrierFlags,0x4000);
    std::vector<vk::VkMemoryBarrier,_std::allocator<vk::VkMemoryBarrier>_>::push_back
              (&buffer->memoryBarrier,(value_type *)&local_b8);
  }
  return;
}

Assistant:

void createVulkanBuffer (const DeviceInterface& vkd, VkDevice device, Allocator& allocator, const BufferParameters& bufferParameters, Buffer& buffer, MemoryRequirement visibility)
{
	VkBufferCreateInfo	bufferCreateParams;

	deMemset(&bufferCreateParams, 0xcd, sizeof(bufferCreateParams));
	bufferCreateParams.sType					= VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
	bufferCreateParams.pNext					= DE_NULL;
	bufferCreateParams.flags					= 0;
	bufferCreateParams.size						= bufferParameters.size;
	bufferCreateParams.usage					= bufferParameters.usage;
	bufferCreateParams.sharingMode				= bufferParameters.sharingMode;
	bufferCreateParams.queueFamilyIndexCount	= bufferParameters.queueFamilyCount;
	bufferCreateParams.pQueueFamilyIndices		= bufferParameters.queueFamilyIndex;

	buffer.buffer		= createBuffer(vkd, device, &bufferCreateParams);
	buffer.allocation	= allocator.allocate(getBufferMemoryRequirements(vkd, device, *buffer.buffer), visibility);

	VK_CHECK(vkd.bindBufferMemory(device, *buffer.buffer, buffer.allocation->getMemory(), buffer.allocation->getOffset()));

	// If caller provides a host memory buffer for the allocation, then go
	// ahead and copy the provided data into the allocation and update the
	// barrier list with the associated access
	if (bufferParameters.memory != DE_NULL)
	{
		VkMemoryBarrier				barrier;
		VkMappedMemoryRange			range;

		deMemset(&range, 0xcd, sizeof(range));
		range.sType		= VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
		range.pNext		= DE_NULL;
		range.memory	= buffer.allocation->getMemory();
		range.offset	= buffer.allocation->getOffset();
		range.size		= bufferParameters.size;

		deMemcpy(buffer.allocation->getHostPtr(), bufferParameters.memory, (size_t)bufferParameters.size);
		VK_CHECK(vkd.flushMappedMemoryRanges(device, 1, &range));

		deMemset(&barrier, 0xcd, sizeof(barrier));
		barrier.sType			= VK_STRUCTURE_TYPE_MEMORY_BARRIER;
		barrier.pNext			= DE_NULL;
		barrier.srcAccessMask	= VK_ACCESS_HOST_WRITE_BIT;
		barrier.dstAccessMask	= bufferParameters.inputBarrierFlags;

		buffer.memoryBarrier.push_back(barrier);
	}
}